

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solution-graph.hxx
# Opt level: O3

void __thiscall
lineage::SolutionGraph::SolutionGraph
          (SolutionGraph *this,ProblemGraph *problemGraph,Solution *solution)

{
  Digraph *this_00;
  Graph *graph;
  vector<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
  *this_01;
  vector<unsigned_long,std::allocator<unsigned_long>> *this_02;
  Value VVar1;
  Value VVar2;
  unsigned_long uVar3;
  iterator __position;
  pointer pAVar4;
  pointer pAVar5;
  pointer pVVar6;
  pointer pAVar7;
  iterator __position_00;
  ulong uVar8;
  pointer puVar9;
  pointer puVar10;
  _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
  *this_03;
  pointer pvVar11;
  _Rb_tree_node_base *p_Var12;
  mapped_type *pmVar13;
  pointer pRVar14;
  size_t sVar15;
  pointer puVar16;
  ulong uVar17;
  pointer pAVar18;
  pointer pAVar19;
  pointer pEVar20;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_04;
  unsigned_long uVar21;
  unsigned_long uVar22;
  difference_type __d;
  ulong uVar23;
  mapped_type *pmVar24;
  unsigned_long uVar25;
  ulong uVar26;
  Index v0Component;
  map<unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
  descendants;
  ComponentLabeling componentsPerFrame;
  Index v1Component;
  SubgraphCutPerFrame subgraphCutPerFrame;
  unsigned_long local_e0;
  undefined1 local_d8 [32];
  _Base_ptr local_b8;
  pointer pAStack_b0;
  pointer local_a8;
  Solution *local_90;
  Partition<unsigned_long> local_88;
  long local_50;
  Value local_48;
  SubgraphWithoutCutAndInterFrameEdges<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_40;
  
  this->problemGraph_ = problemGraph;
  this->solution_ = solution;
  this_04 = &this->cellOfNode_;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (this_04,((long)(problemGraph->problem_->nodes).
                            super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(problemGraph->problem_->nodes).
                            super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
             (allocator_type *)local_d8);
  this_00 = &this->lineageGraph_;
  (this->lineageGraph_).edges_.
  super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->lineageGraph_).edges_.
  super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->lineageGraph_).vertices_.
  super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->lineageGraph_).edges_.
  super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lineageGraph_).vertices_.
  super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lineageGraph_).vertices_.
  super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->lineageGraph_).multipleEdgesEnabled_ = false;
  (this->nodesOfCell_).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nodesOfCell_).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->nodesOfCell_).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  validate(problemGraph,solution);
  local_40.problem_ = this->problemGraph_->problem_;
  local_88.ranks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.ranks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.parents_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.ranks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.parents_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.parents_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.numberOfSets_ = 0;
  graph = &problemGraph->graph_;
  local_90 = solution;
  local_40.edgeLabels_ = &solution->edge_labels;
  andres::graph::
  ComponentsByPartition<andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>>>::
  build<lineage::ProblemGraph::SubgraphWithoutCutAndInterFrameEdges<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((ComponentsByPartition<andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>>>
              *)&local_88,graph,&local_40);
  if (problemGraph->numberOfFrames_ != 1) {
    uVar17 = 0;
    do {
      local_d8._24_8_ = local_d8 + 8;
      local_d8._8_8_ = local_d8._8_8_ & 0xffffffff00000000;
      local_d8._16_8_ = (_Base_ptr)0x0;
      pAStack_b0 = (pointer)0x0;
      pvVar11 = (problemGraph->nodeIndicesInFrame_).
                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar16 = pvVar11[uVar17].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start;
      local_b8 = (_Base_ptr)local_d8._24_8_;
      if (*(pointer *)
           ((long)&pvVar11[uVar17].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                   ._M_impl.super__Vector_impl_data + 8) != puVar16) {
        uVar26 = 0;
        do {
          uVar22 = puVar16[uVar26];
          uVar25 = uVar22;
          do {
            local_e0 = uVar25;
            uVar25 = local_88.parents_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[local_e0];
            uVar3 = uVar22;
          } while (local_88.parents_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start[local_e0] != local_e0);
          while (local_e0 != uVar3) {
            uVar25 = local_88.parents_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar3];
            local_88.parents_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar3] = local_e0;
            uVar3 = uVar25;
          }
          pRVar14 = (graph->vertices_).
                    super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pAVar18 = *(pointer *)
                     &pRVar14[uVar22].vector_.
                      super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
          ;
          if (pAVar18 !=
              *(pointer *)
               ((long)&pRVar14[uVar22].vector_.
                       super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
               + 8)) {
            do {
              VVar1 = pAVar18->vertex_;
              if ((uVar17 + 1 ==
                   (long)*(int *)((long)(this->problemGraph_->problem_->nodes).
                                        super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
                                        ._M_impl.super__Vector_impl_data._M_start + VVar1 * 0x18))
                 && (VVar2 = VVar1,
                    (local_90->edge_labels).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start[pAVar18->edge_] == '\0')) {
                do {
                  local_48 = VVar2;
                  VVar2 = local_88.parents_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start[local_48];
                } while (local_88.parents_.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start[local_48] != local_48);
                while (local_48 != VVar1) {
                  VVar2 = local_88.parents_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start[VVar1];
                  local_88.parents_.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start[VVar1] = local_48;
                  VVar1 = VVar2;
                }
                this_03 = (_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                           *)std::
                             map<unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
                             ::operator[]((map<unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
                                           *)local_d8,&local_e0);
                std::
                _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                ::_M_insert_unique<unsigned_long_const&>(this_03,&local_48);
                pRVar14 = (graph->vertices_).
                          super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
              }
              pAVar18 = pAVar18 + 1;
            } while (pAVar18 !=
                     *(pointer *)
                      ((long)&pRVar14[uVar22].vector_.
                              super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                      + 8));
            pvVar11 = (problemGraph->nodeIndicesInFrame_).
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          }
          puVar10 = local_88.ranks_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start;
          puVar9 = local_88.parents_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar26 = uVar26 + 1;
          puVar16 = pvVar11[uVar17].
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start;
        } while (uVar26 < (ulong)((long)*(pointer *)
                                         ((long)&pvVar11[uVar17].
                                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                 ._M_impl.super__Vector_impl_data + 8) -
                                  (long)puVar16 >> 3));
        for (p_Var12 = (_Rb_tree_node_base *)local_d8._24_8_;
            p_Var12 != (_Rb_tree_node_base *)(local_d8 + 8);
            p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12)) {
          if (p_Var12[2]._M_left == (_Base_ptr)0x1) {
            uVar22 = *(unsigned_long *)(p_Var12 + 1);
            uVar25 = *(unsigned_long *)(*(long *)(p_Var12 + 2) + 0x20);
            uVar3 = uVar22;
            do {
              uVar21 = uVar3;
              uVar3 = puVar9[uVar21];
            } while (puVar9[uVar21] != uVar21);
            while (uVar3 = uVar25, uVar21 != uVar22) {
              uVar3 = puVar9[uVar22];
              puVar9[uVar22] = uVar21;
              uVar22 = uVar3;
            }
            do {
              uVar22 = uVar3;
              uVar3 = puVar9[uVar22];
            } while (puVar9[uVar22] != uVar22);
            while (uVar22 != uVar25) {
              uVar3 = puVar9[uVar25];
              puVar9[uVar25] = uVar22;
              uVar25 = uVar3;
            }
            if (puVar10[uVar21] < puVar10[uVar22]) {
              puVar9[uVar21] = uVar22;
            }
            else if (puVar10[uVar22] < puVar10[uVar21]) {
              puVar9[uVar22] = uVar21;
            }
            else {
              if (uVar21 == uVar22) goto LAB_00112656;
              puVar9[uVar22] = uVar21;
              puVar10[uVar21] = puVar10[uVar21] + 1;
            }
            local_88.numberOfSets_ = local_88.numberOfSets_ - 1;
          }
LAB_00112656:
        }
      }
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
                   *)local_d8);
      uVar17 = uVar17 + 1;
    } while (uVar17 < problemGraph->numberOfFrames_ - 1);
  }
  local_d8._16_8_ = (_Base_ptr)0x0;
  local_d8._0_8_ = (pointer)0x0;
  local_d8._8_8_ = (pointer)0x0;
  local_b8 = (_Base_ptr)0x0;
  pAStack_b0 = (pointer)0x0;
  local_a8 = (pointer)0x0;
  std::
  vector<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
  ::_M_fill_insert(&this_00->vertices_,
                   (this->lineageGraph_).vertices_.
                   super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                   ._M_impl.super__Vector_impl_data._M_finish,local_88.numberOfSets_,
                   (value_type *)local_d8);
  if (local_b8 != (_Base_ptr)0x0) {
    operator_delete(local_b8,(long)local_a8 - (long)local_b8);
  }
  if ((pointer)local_d8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_d8._0_8_,local_d8._16_8_ - local_d8._0_8_);
  }
  pmVar24 = (this_04->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_d8._24_8_ = local_d8 + 8;
  local_d8._8_8_ = local_d8._8_8_ & 0xffffffff00000000;
  local_d8._16_8_ = (_Base_ptr)0x0;
  pAStack_b0 = (pointer)0x0;
  local_b8 = (_Base_ptr)local_d8._24_8_;
  andres::Partition<unsigned_long>::representativeLabeling
            (&local_88,
             (map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
              *)local_d8);
  if (local_88.parents_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_88.parents_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar25 = 0;
    uVar22 = uVar25;
    do {
      do {
        local_e0 = uVar22;
        uVar22 = local_88.parents_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                 ._M_impl.super__Vector_impl_data._M_start[local_e0];
      } while (local_88.parents_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start[local_e0] != local_e0);
      pmVar13 = std::
                map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                ::operator[]((map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                              *)local_d8,&local_e0);
      *pmVar24 = *pmVar13;
      pmVar24 = pmVar24 + 1;
      uVar25 = uVar25 + 1;
      uVar22 = uVar25;
    } while (uVar25 < (ulong)((long)local_88.parents_.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_88.parents_.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
               *)local_d8);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::resize(&this->nodesOfCell_,
           (long)(this->lineageGraph_).vertices_.
                 super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->lineageGraph_).vertices_.
                 super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 6);
  local_d8._0_8_ = (pointer)0x0;
  puVar16 = (this->cellOfNode_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->cellOfNode_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar16) {
    do {
      this_02 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
                ((this->nodesOfCell_).
                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + puVar16[local_d8._0_8_]);
      __position._M_current = *(unsigned_long **)(this_02 + 8);
      if (__position._M_current == *(unsigned_long **)(this_02 + 0x10)) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>(this_02,__position,(unsigned_long *)local_d8);
      }
      else {
        *__position._M_current = local_d8._0_8_;
        *(unsigned_long **)(this_02 + 8) = __position._M_current + 1;
      }
      local_d8._0_8_ = (long)(Value *)local_d8._0_8_ + 1;
      puVar16 = (this->cellOfNode_).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while ((ulong)local_d8._0_8_ <
             (pointer)((long)(this->cellOfNode_).
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)puVar16 >> 3));
  }
  sVar15 = problemGraph->numberOfFrames_;
  if (sVar15 != 1) {
    this_01 = &(this->lineageGraph_).edges_;
    pvVar11 = (problemGraph->nodeIndicesInFrame_).
              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar17 = 0;
    do {
      local_50 = uVar17 * 3;
      puVar16 = pvVar11[uVar17].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar26 = uVar17 + 1;
      if (*(pointer *)
           ((long)&pvVar11[uVar17].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                   ._M_impl.super__Vector_impl_data + 8) != puVar16) {
        pRVar14 = (graph->vertices_).
                  super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar17 = 0;
        do {
          uVar22 = puVar16[uVar17];
          pAVar18 = *(pointer *)
                     &pRVar14[uVar22].vector_.
                      super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
          ;
          if (pAVar18 !=
              *(pointer *)
               ((long)&pRVar14[uVar22].vector_.
                       super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
               + 8)) {
            do {
              if ((uVar26 == (long)*(int *)((long)(this->problemGraph_->problem_->nodes).
                                                  super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                           pAVar18->vertex_ * 0x18)) &&
                 ((local_90->edge_labels).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start[pAVar18->edge_] == '\0')) {
                puVar16 = (this_04->
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                          .super__Vector_impl_data._M_start;
                pAVar4 = (pointer)puVar16[uVar22];
                pAVar5 = (pointer)puVar16[pAVar18->vertex_];
                if (pAVar4 != pAVar5) {
                  if ((this->lineageGraph_).multipleEdgesEnabled_ != true) {
                    pVVar6 = (this_00->vertices_).
                             super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    pAVar19 = *(pointer *)
                               &pVVar6[(long)pAVar4].to_.vector_.
                                super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                    ;
                    pAVar7 = *(pointer *)((long)&pVVar6[(long)pAVar4].to_.vector_ + 8);
                    uVar23 = (long)pAVar7 - (long)pAVar19 >> 4;
                    while (uVar8 = uVar23, 0 < (long)uVar8) {
                      uVar23 = uVar8 >> 1;
                      if ((pointer)pAVar19[uVar23].vertex_ < pAVar5) {
                        pAVar19 = pAVar19 + uVar23 + 1;
                        uVar23 = ~uVar23 + uVar8;
                      }
                    }
                    if ((pAVar7 != pAVar19) && ((pointer)pAVar19->vertex_ == pAVar5))
                    goto LAB_00112993;
                  }
                  __position_00._M_current =
                       (this->lineageGraph_).edges_.
                       super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  local_d8._0_8_ = pAVar4;
                  local_d8._8_8_ = pAVar5;
                  if (__position_00._M_current ==
                      (this->lineageGraph_).edges_.
                      super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::
                    vector<andres::graph::detail::Edge<true,unsigned_long>,std::allocator<andres::graph::detail::Edge<true,unsigned_long>>>
                    ::_M_realloc_insert<andres::graph::detail::Edge<true,unsigned_long>>
                              ((vector<andres::graph::detail::Edge<true,unsigned_long>,std::allocator<andres::graph::detail::Edge<true,unsigned_long>>>
                                *)this_01,__position_00,(Edge<true,_unsigned_long> *)local_d8);
                    pEVar20 = (this->lineageGraph_).edges_.
                              super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
                  }
                  else {
                    (__position_00._M_current)->vertexIndices_[0] = (Value)pAVar4;
                    (__position_00._M_current)->vertexIndices_[1] = (Value)pAVar5;
                    pEVar20 = (this->lineageGraph_).edges_.
                              super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish + 1;
                    (this->lineageGraph_).edges_.
                    super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish = pEVar20;
                  }
                  andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::
                  insertAdjacenciesForEdge
                            (this_00,((long)pEVar20 -
                                      (long)(this_01->
                                            super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start >> 4) - 1);
                  pRVar14 = (graph->vertices_).
                            super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                }
              }
LAB_00112993:
              pAVar18 = pAVar18 + 1;
            } while (pAVar18 !=
                     *(pointer *)
                      ((long)&pRVar14[uVar22].vector_.
                              super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                      + 8));
            pvVar11 = (problemGraph->nodeIndicesInFrame_).
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          }
          uVar17 = uVar17 + 1;
          puVar16 = *(pointer *)
                     ((long)&(pvVar11->
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                             _M_impl.super__Vector_impl_data + local_50 * 8);
        } while (uVar17 < (ulong)(*(long *)((long)&(pvVar11->
                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  )._M_impl.super__Vector_impl_data +
                                           local_50 * 8 + 8) - (long)puVar16 >> 3));
        sVar15 = problemGraph->numberOfFrames_;
      }
      uVar17 = uVar26;
    } while (uVar26 < sVar15 - 1);
  }
  if (local_88.ranks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.ranks_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.ranks_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.ranks_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_88.parents_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.parents_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.parents_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.parents_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

SolutionGraph(const ProblemGraph& problemGraph, const Solution& solution) :
        problemGraph_(problemGraph),
        solution_(solution),
        cellOfNode_(problemGraph.problem().nodes.size())
    {
        typedef andres::graph::ComponentsByPartition<Graph> ComponentLabeling;
        typedef ProblemGraph::SubgraphWithoutCutAndInterFrameEdges<Solution::EdgeLabels> SubgraphCutPerFrame;

        validate(problemGraph, solution);

        SubgraphCutPerFrame subgraphCutPerFrame(problem(), solution.edge_labels);
        ComponentLabeling componentsPerFrame;
        componentsPerFrame.build(problemGraph.graph(), subgraphCutPerFrame);

        // join components c0 (at time t) and c1 (at time t+1) iff
        // c1 is the unique descendant of c0
        for (size_t frame = 0; frame < problemGraph.numberOfFrames() - 1; ++frame)
        {
            std::map<size_t, std::set<size_t>> descendants;
            for (size_t j = 0; j < problemGraph.numberOfNodesInFrame(frame); ++j)
            {
                auto v0 = problemGraph.nodeInFrame(frame, j);
                auto v0Component = componentsPerFrame.partition_.find(v0);
                
                for (auto it = problemGraph.graph().adjacenciesFromVertexBegin(v0);
                    it != problemGraph.graph().adjacenciesFromVertexEnd(v0); ++it)
                {
                    auto v1 = it->vertex();

                    if (problem().nodes[v1].t == frame + 1 && solution.edge_labels[it->edge()] == 0)
                    {
                        auto v1Component = componentsPerFrame.partition_.find(v1);

                        descendants[v0Component].insert(v1Component);
                    }
                }
            }

            for (auto& p: descendants)
                if (p.second.size() == 1)
                {
                    auto v0Component = p.first;
                    auto v1Component = *(p.second.begin());

                    componentsPerFrame.partition_.merge(v0Component, v1Component);
                }
        }

        lineageGraph_.insertVertices(componentsPerFrame.partition_.numberOfSets());
        // from now on, member function numberOfCells works

        componentsPerFrame.partition_.elementLabeling(cellOfNode_.begin());

        nodesOfCell_.resize(numberOfCells());
        for (size_t v = 0; v < numberOfNodes(); ++v)
            nodesOfCell_[cellOfNode_[v]].push_back(v);

        for (size_t frame = 0; frame < problemGraph.numberOfFrames() - 1; ++frame)
            for (size_t j = 0; j < problemGraph.numberOfNodesInFrame(frame); ++j)
            {
                auto v0 = problemGraph.nodeInFrame(frame, j);

                for (auto it = problemGraph.graph().adjacenciesFromVertexBegin(v0);
                    it != problemGraph.graph().adjacenciesFromVertexEnd(v0); ++it)
                {
                    auto v1 = it->vertex();

                    if (problem().nodes[v1].t == frame + 1 && solution.edge_labels[it->edge()] == 0)
                    {
                        auto c0 = cellOfNode_[v0];
                        auto c1 = cellOfNode_[v1];

                        if (c0 != c1)
                            lineageGraph_.insertEdge(c0, c1);
                    }
                }
            }
    }